

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall Liby::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  char *pcVar4;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  int clfd;
  Endpoint local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  Endpoint local_34;
  socklen_t address_len;
  sockaddr_in address;
  
  iVar1 = *(int *)(CONCAT44(in_register_00000034,__fd) + 4);
  if (iVar1 < 0) {
    __assert_fail("fd() >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,0xd,"SockPtr Liby::Socket::accept()");
  }
  address_len = 0x10;
  iVar1 = ::accept(iVar1,(sockaddr *)&address,&address_len);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 == 4) {
      accept(this,__fd,__addr_00,__addr_len);
    }
    else {
      if (*piVar2 != 0xb) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = strerror(*piVar2);
        *puVar3 = pcVar4;
        __cxa_throw(puVar3,&char*::typeinfo,0);
      }
      this->isUdp_ = false;
      *(undefined3 *)&this->field_0x1 = 0;
      this->fd_ = 0;
      (this->fp_).super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
  }
  else {
    std::make_shared<Liby::FileDescriptor,int&>((int *)&local_48);
    Endpoint::Endpoint(&local_34,&address);
    std::make_shared<Liby::Socket,std::shared_ptr<Liby::FileDescriptor>,Liby::Endpoint>
              ((shared_ptr<Liby::FileDescriptor> *)this,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  }
  return (int)this;
}

Assistant:

SockPtr Socket::accept() {
    assert(fd() >= 0);

    struct sockaddr_in address;
    // remember to init address_len
    socklen_t address_len = sizeof(address);
    int clfd = ::accept(fd(), (struct sockaddr *)&address, &address_len);
    if (clfd < 0) {
        if (errno == EAGAIN) {
            return nullptr;
        } else if (errno == EINTR) {
            return accept();
        } else {
            auto i = errno;
            ClearUnuseVariableWarning(i);
            throw ::strerror(errno);
        }
    } else {
        return std::make_shared<Socket>(
            std::make_shared<FileDescriptor>(clfd),
            Endpoint((struct sockaddr_in *)(&address)));
    }
}